

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::changeColsIntegrality
          (Highs *this,HighsInt num_set_entries,HighsInt *set,HighsVarType *integrality)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  HighsInt create_error;
  HighsStatus HVar2;
  vector<int,_std::allocator<int>_> local_set;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_integrality;
  HighsIndexCollection index_collection;
  vector<int,_std::allocator<int>_> local_1a8;
  HighsVarType *local_190 [3];
  string local_178;
  string local_158;
  HighsIndexCollection local_138;
  HighsLogOptions local_e8;
  HighsLogOptions local_88;
  
  if (num_set_entries == 0) {
    HVar2 = kOk;
  }
  else {
    this->model_presolve_status_ = kNotPresolved;
    HighsModel::clear(&this->presolved_model_);
    PresolveComponent::clear(&this->presolve_);
    std::vector<HighsVarType,std::allocator<HighsVarType>>::vector<HighsVarType_const*,void>
              ((vector<HighsVarType,std::allocator<HighsVarType>> *)local_190,integrality,
               integrality + num_set_entries,(allocator_type *)&local_138);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_1a8,set,set + num_set_entries,
               (allocator_type *)&local_138);
    sortSetData(num_set_entries,&local_1a8,integrality,local_190[0]);
    local_138.dimension_ = -1;
    local_138.is_interval_ = false;
    local_138.from_ = -1;
    local_138.to_ = -2;
    local_138.is_set_ = false;
    local_138.set_num_entries_ = -1;
    local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._1_7_ = 0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    local_138._41_8_ = 0;
    create_error = create(&local_138,num_set_entries,
                          local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
    if (create_error == 0) {
      HVar2 = changeIntegralityInterface(this,&local_138,local_190[0]);
      local_e8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_e8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_e8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_e8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_e8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_e8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      pfVar1 = &local_e8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_e8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_e8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"changeIntegrality","");
      HVar2 = interpretCallStatus(&local_e8,HVar2,kOk,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_e8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
      if (HVar2 == kError) {
        HVar2 = kError;
      }
      else {
        HVar2 = returnFromHighs(this,HVar2);
      }
    }
    else {
      local_88.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_88.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_88.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_88.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_88.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_88.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      pfVar1 = &local_88.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_88.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_88.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"changeColsIntegrality","");
      analyseSetCreateError
                (&local_88,&local_158,create_error,true,num_set_entries,
                 local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      HVar2 = kError;
      if (local_88.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_88.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
    }
    if (local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (HighsInt *)0x0) {
      operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_190[0] != (HighsVarType *)0x0) {
      operator_delete(local_190[0]);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::changeColsIntegrality(const HighsInt num_set_entries,
                                         const HighsInt* set,
                                         const HighsVarType* integrality) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearPresolve();
  // Ensure that the set and data are in ascending order
  std::vector<HighsVarType> local_integrality{integrality,
                                              integrality + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, integrality,
              local_integrality.data());
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsIntegrality",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeIntegralityInterface(index_collection, local_integrality.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeIntegrality");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}